

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::anon_unknown_0::get_valid_length(char_t *data,size_t length)

{
  ulong uStack_28;
  uint8_t ch;
  size_t i;
  size_t length_local;
  char_t *data_local;
  
  if (length < 5) {
    data_local = (char_t *)0x0;
  }
  else {
    for (uStack_28 = 1; data_local = (char_t *)length, uStack_28 < 5; uStack_28 = uStack_28 + 1) {
      if ((data[length - uStack_28] & 0xc0) != 0x80) {
        return length - uStack_28;
      }
    }
  }
  return (size_t)data_local;
}

Assistant:

PUGI__FN size_t get_valid_length(const char_t* data, size_t length)
	{
		if (length < 5) return 0;

		for (size_t i = 1; i <= 4; ++i)
		{
			uint8_t ch = static_cast<uint8_t>(data[length - i]);

			// either a standalone character or a leading one
			if ((ch & 0xc0) != 0x80) return length - i;
		}

		// there are four non-leading characters at the end, sequence tail is broken so might as well process the whole chunk
		return length;
	}